

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  Select **ppSVar1;
  byte *pbVar2;
  u32 *puVar3;
  u8 uVar4;
  undefined4 p1;
  sqlite3 *psVar5;
  undefined4 uVar8;
  SrcList *pSVar6;
  Vdbe *p_00;
  Parse *pPVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  byte bVar12;
  u8 uVar13;
  LogEst LVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int p2;
  int iVar22;
  int iVar23;
  Vdbe *pVVar24;
  Select *pSVar25;
  int *zP4;
  KeyInfo *pKVar26;
  CollSeq *pCVar27;
  ExprList *pEVar28;
  Op *pOVar29;
  Expr *pEVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  Select *pSVar34;
  anon_union_4_2_6146edf4_for_u *paVar35;
  char *pcVar36;
  int nExtra;
  ulong extraout_RDX;
  ulong uVar37;
  Select *pSVar38;
  short sVar39;
  bool bVar40;
  int iVar41;
  int iVar42;
  Select *pSVar43;
  int iVar44;
  long in_FS_OFFSET;
  Select *local_170;
  KeyInfo *local_f8;
  SelectDest local_d8;
  undefined8 local_a8;
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  undefined4 uStack_94;
  char *pcStack_90;
  ExprList *local_88;
  SelectDest destA;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = pParse->db;
  pSVar43 = p->pPrior;
  local_d8.pOrderBy = pDest->pOrderBy;
  local_d8.eDest = pDest->eDest;
  local_d8._1_3_ = *(undefined3 *)&pDest->field_0x1;
  local_d8.iSDParm = pDest->iSDParm;
  uVar9 = pDest->iSDParm2;
  uVar10 = pDest->iSdst;
  local_d8.zAffSdst = pDest->zAffSdst;
  local_d8.nSdst = (int)*(undefined8 *)&pDest->nSdst;
  local_d8._20_4_ = SUB84((ulong)*(undefined8 *)&pDest->nSdst >> 0x20,0);
  local_d8.iSDParm2 = uVar9;
  local_d8.iSdst = uVar10;
  pVVar24 = sqlite3GetVdbe(pParse);
  uVar13 = local_d8.eDest;
  if (local_d8.eDest == '\f') {
    sqlite3VdbeAddOp3(pVVar24,0x75,local_d8.iSDParm,p->pEList->nExpr,0);
    local_d8.eDest = '\x0e';
    uVar13 = '\x0e';
  }
  if ((p->selFlags >> 10 & 1) != 0) {
    pEVar30 = p->pLimit;
    if (p->pWin == (Window *)0x0) {
      sVar39 = 1;
      pSVar25 = p;
      do {
        pSVar38 = pSVar25->pPrior;
        if (pSVar38 == (Select *)0x0) {
          sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
          goto LAB_0018a484;
        }
        sVar39 = sVar39 + (ushort)(pEVar30 == (Expr *)0x0);
        pSVar25 = pSVar38;
      } while (pSVar38->pWin == (Window *)0x0);
    }
  }
  pSVar25 = p;
  if ((p->selFlags >> 0xd & 1) != 0) {
    do {
      if ((pSVar25->selFlags & 0x2000) == 0) {
        pSVar6 = p->pSrc;
        iVar16 = p->pEList->nExpr;
        p_00 = pParse->pVdbe;
        destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        destA.nSdst = -0x55555556;
        destA._20_4_ = 0xaaaaaaaa;
        destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
        destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        destA.iSDParm2 = -0x55555556;
        destA.iSdst = -0x55555556;
        if (p->pWin != (Window *)0x0) {
          sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
          goto LAB_0018afbb;
        }
        iVar22 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
        if (iVar22 != 0) goto LAB_0018afbb;
        iVar20 = pParse->nLabel + -1;
        pParse->nLabel = iVar20;
        p->nSelectRow = 0x140;
        computeLimitRegisters(pParse,p,iVar20);
        pEVar30 = p->pLimit;
        iVar22 = p->iLimit;
        iVar15 = p->iOffset;
        p->pLimit = (Expr *)0x0;
        p->iLimit = 0;
        p->iOffset = 0;
        iVar21 = 0;
        if ((long)pSVar6->nSrc < 1) goto LAB_0018aa22;
        lVar31 = 0;
        goto LAB_0018a562;
      }
      ppSVar1 = &pSVar25->pPrior;
      pSVar25 = *ppSVar1;
    } while (*ppSVar1 != (Select *)0x0);
  }
  pEVar28 = p->pOrderBy;
  if (pEVar28 != (ExprList *)0x0) {
    destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    destA.nSdst = -0x55555556;
    destA._20_4_ = 0xaaaaaaaa;
    destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
    destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    destA.iSDParm2 = -0x55555556;
    destA.iSdst = -0x55555556;
    local_88 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    iStack_98 = -0x55555556;
    uStack_94 = 0xaaaaaaaa;
    pcStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    iStack_a0 = -0x55555556;
    iStack_9c = -0x55555556;
    psVar5 = pParse->db;
    pVVar24 = pParse->pVdbe;
    iVar16 = pParse->nLabel;
    iVar15 = iVar16 + -2;
    pParse->nLabel = iVar15;
    uVar13 = p->op;
    iVar22 = pEVar28->nExpr;
    if ((uVar13 != 0x88) && (psVar5->mallocFailed == '\0')) {
      uVar17 = 1;
      do {
        if (p->pEList->nExpr < (int)uVar17) break;
        if (iVar22 < 1) {
          iVar21 = 0;
LAB_0018a5ba:
          if (iVar21 == iVar22) goto LAB_0018a5bf;
        }
        else {
          paVar35 = &pEVar28->a[0].u;
          iVar21 = 0;
          do {
            if (uVar17 == (paVar35->x).iOrderByCol) goto LAB_0018a5ba;
            iVar21 = iVar21 + 1;
            paVar35 = paVar35 + 6;
          } while (iVar22 != iVar21);
LAB_0018a5bf:
          local_48.n = 0;
          local_48._12_4_ = 0xaaaaaaaa;
          local_48.z = (char *)0x0;
          pEVar30 = sqlite3ExprAlloc(psVar5,0x9c,&local_48,0);
          if (pEVar30 == (Expr *)0x0) {
            uVar17 = 7;
            goto LAB_0018b071;
          }
          pbVar2 = (byte *)((long)&pEVar30->flags + 1);
          *pbVar2 = *pbVar2 | 8;
          (pEVar30->u).iValue = uVar17;
          pEVar28 = sqlite3ExprListAppend(pParse,pEVar28,pEVar30);
          p->pOrderBy = pEVar28;
          if (pEVar28 == (ExprList *)0x0) {
            pEVar28 = (ExprList *)0x0;
          }
          else {
            lVar31 = (long)iVar22;
            iVar22 = iVar22 + 1;
            pEVar28->a[lVar31].u.x.iOrderByCol = (u16)uVar17;
          }
        }
        uVar17 = uVar17 + 1;
      } while (psVar5->mallocFailed == '\0');
    }
    zP4 = (int *)sqlite3DbMallocRawNN(psVar5,(long)(int)(iVar22 + 1U) << 2);
    iVar21 = 0;
    if (zP4 == (int *)0x0) {
      local_f8 = (KeyInfo *)0x0;
    }
    else {
      *zP4 = iVar22;
      uVar37 = extraout_RDX;
      if (0 < iVar22) {
        paVar35 = &pEVar28->a[0].u;
        uVar37 = 1;
        do {
          zP4[uVar37] = (paVar35->x).iOrderByCol - 1;
          uVar37 = uVar37 + 1;
          paVar35 = paVar35 + 6;
        } while (iVar22 + 1U != uVar37);
      }
      local_f8 = multiSelectOrderByKeyInfo(pParse,p,(int)uVar37);
    }
    iVar16 = iVar16 + -1;
    pSVar43 = p;
    if (uVar13 == 0x88) {
      pKVar26 = (KeyInfo *)0x0;
LAB_00189c59:
      bVar11 = true;
      if (((psVar5->dbOptFlags & 0x200000) == 0) && (p->pPrior != (Select *)0x0)) {
        uVar17 = 1;
        pSVar25 = p->pPrior;
        pSVar38 = p;
        do {
          pSVar34 = pSVar25;
          if (pSVar38->op != uVar13) break;
          uVar17 = uVar17 + 1;
          pSVar25 = pSVar34->pPrior;
          pSVar38 = pSVar34;
        } while (pSVar25 != (Select *)0x0);
        if (3 < uVar17) {
          uVar32 = 2;
          do {
            pSVar43 = pSVar43->pPrior;
            uVar32 = uVar32 + 2;
          } while (uVar32 < uVar17);
        }
      }
    }
    else {
      uVar17 = p->pEList->nExpr;
      iVar21 = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + uVar17 + 1;
      sqlite3VdbeAddOp3(pVVar24,0x47,0,iVar21,0);
      pKVar26 = sqlite3KeyInfoAlloc(psVar5,uVar17,1);
      if (0 < (int)uVar17 && pKVar26 != (KeyInfo *)0x0) {
        uVar37 = 0;
        do {
          pCVar27 = multiSelectCollSeq(pParse,p,(int)uVar37);
          pKVar26->aColl[uVar37] = pCVar27;
          pKVar26->aSortFlags[uVar37] = '\0';
          uVar37 = uVar37 + 1;
        } while (uVar17 != uVar37);
      }
      if ((byte)(uVar13 + 0x79) < 2) goto LAB_00189c59;
      bVar11 = false;
    }
    pSVar25 = pSVar43->pPrior;
    pSVar43->pPrior = (Select *)0x0;
    iVar20 = 0;
    pSVar25->pNext = (Select *)0x0;
    pEVar28 = sqlite3ExprListDup(pParse->db,pEVar28,0);
    pSVar25->pOrderBy = pEVar28;
    sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
    sqlite3ResolveOrderGroupBy(pParse,pSVar25,pSVar25->pOrderBy,"ORDER");
    computeLimitRegisters(pParse,p,iVar16);
    iVar23 = p->iLimit;
    iVar44 = 0;
    if (iVar23 != 0 && uVar13 == 0x88) {
      iVar20 = pParse->nMem + 1;
      iVar44 = pParse->nMem + 2;
      pParse->nMem = iVar44;
      iVar33 = p->iOffset + 1;
      if (p->iOffset == 0) {
        iVar33 = iVar23;
      }
      sqlite3VdbeAddOp3(pVVar24,0x50,iVar33,iVar20,0);
      sqlite3VdbeAddOp3(pVVar24,0x50,iVar20,iVar44,0);
    }
    if (p->pLimit != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar5,p->pLimit);
    }
    p->pLimit = (Expr *)0x0;
    iVar41 = pParse->nMem;
    iVar23 = iVar41 + 1;
    iVar33 = iVar41 + 2;
    iVar42 = iVar41 + 4;
    pParse->nMem = iVar42;
    destA.eDest = '\r';
    destA.iSDParm = iVar23;
    destA.iSDParm2 = 0;
    destA.zAffSdst = (char *)0x0;
    destA.iSdst = 0;
    destA.nSdst = 0;
    local_a8._0_1_ = '\r';
    local_a8 = (undefined1 *)CONCAT44(iVar33,(undefined4)local_a8);
    iStack_a0 = 0;
    pcStack_90 = (char *)0x0;
    iStack_9c = 0;
    iStack_98 = 0;
    iVar41 = iVar41 + 3;
    sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
    iVar18 = sqlite3VdbeAddOp3(pVVar24,0xb,iVar23,0,pVVar24->nOp + 1);
    pSVar25->iLimit = iVar20;
    sqlite3VdbeExplain(pParse,'\x01',"LEFT");
    sqlite3Select(pParse,pSVar25,&destA);
    sqlite3VdbeAddOp3(pVVar24,0x44,iVar23,0,0);
    pPVar7 = pVVar24->pParse;
    pPVar7->nTempReg = '\0';
    pPVar7->nRangeReg = 0;
    iVar20 = pVVar24->nOp;
    if (pVVar24->db->mallocFailed == '\0') {
      pOVar29 = pVVar24->aOp + iVar18;
    }
    else {
      pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar29->p2 = iVar20;
    iVar19 = sqlite3VdbeAddOp3(pVVar24,0xb,iVar33,0,iVar20 + 1);
    iVar20 = p->iLimit;
    iVar18 = p->iOffset;
    p->iLimit = iVar44;
    p->iOffset = 0;
    sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
    sqlite3Select(pParse,p,(SelectDest *)&local_a8);
    p->iLimit = iVar20;
    p->iOffset = iVar18;
    sqlite3VdbeAddOp3(pVVar24,0x44,iVar33,0,0);
    pPVar7 = pVVar24->pParse;
    pPVar7->nTempReg = '\0';
    iVar20 = 0;
    pPVar7->nRangeReg = 0;
    iVar44 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar41,iVar21,pKVar26,iVar16);
    if (bVar11) {
      iVar20 = generateOutputSubroutine
                         (pParse,p,(SelectDest *)&local_a8,pDest,iVar42,iVar21,pKVar26,iVar16);
    }
    if ((pKVar26 != (KeyInfo *)0x0) && (pKVar26->nRef = pKVar26->nRef - 1, pKVar26->nRef == 0)) {
      sqlite3DbNNFreeNN(pKVar26->db,pKVar26);
    }
    if ((byte)(uVar13 + 0x77) < 2) {
      iVar21 = iVar16;
      iVar18 = iVar16;
      if (uVar13 != 0x8a) goto LAB_0018a170;
      p2 = iVar16;
      if (pSVar25->nSelectRow < p->nSelectRow) {
        p->nSelectRow = pSVar25->nSelectRow;
      }
    }
    else {
      iVar18 = sqlite3VdbeAddOp3(pVVar24,10,iVar42,iVar20,0);
      iVar21 = sqlite3VdbeAddOp3(pVVar24,0xc,iVar33,iVar16,0);
      sqlite3VdbeAddOp3(pVVar24,9,0,iVar18,0);
      LVar14 = sqlite3LogEstAdd(p->nSelectRow,pSVar25->nSelectRow);
      p->nSelectRow = LVar14;
LAB_0018a170:
      p2 = sqlite3VdbeAddOp3(pVVar24,10,iVar41,iVar44,0);
      sqlite3VdbeAddOp3(pVVar24,0xc,iVar23,iVar16,0);
      sqlite3VdbeAddOp3(pVVar24,9,0,p2,0);
    }
    iVar41 = sqlite3VdbeAddOp3(pVVar24,10,iVar41,iVar44,0);
    sqlite3VdbeAddOp3(pVVar24,0xc,iVar23,iVar18,0);
    sqlite3VdbeAddOp3(pVVar24,9,0,iVar15,0);
    iVar44 = iVar41;
    if (uVar13 != 0x88) {
      if (uVar13 == 0x8a) {
        iVar41 = iVar41 + 1;
      }
      else {
        iVar44 = sqlite3VdbeAddOp3(pVVar24,0xc,iVar23,iVar18,0);
        sqlite3VdbeAddOp3(pVVar24,9,0,iVar15,0);
      }
    }
    iVar18 = pVVar24->nOp;
    if (bVar11) {
      sqlite3VdbeAddOp3(pVVar24,10,iVar42,iVar20,0);
    }
    sqlite3VdbeAddOp3(pVVar24,0xc,iVar33,p2,0);
    sqlite3VdbeAddOp3(pVVar24,9,0,iVar15,0);
    if (pVVar24->db->mallocFailed == '\0') {
      pOVar29 = pVVar24->aOp + iVar19;
    }
    else {
      pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar29->p2 = pVVar24->nOp;
    sqlite3VdbeAddOp3(pVVar24,0xc,iVar23,iVar21,0);
    sqlite3VdbeAddOp3(pVVar24,0xc,iVar33,p2,0);
    sqlite3VdbeResolveLabel(pVVar24,iVar15);
    iVar15 = sqlite3VdbeAddOp3(pVVar24,0x59,0,0,0);
    sqlite3VdbeChangeP4(pVVar24,iVar15,(char *)zP4,-0xe);
    iVar22 = sqlite3VdbeAddOp3(pVVar24,0x5a,destA.iSdst,iStack_9c,iVar22);
    sqlite3VdbeChangeP4(pVVar24,iVar22,(char *)local_f8,-8);
    if (0 < (long)pVVar24->nOp) {
      pVVar24->aOp[(long)pVVar24->nOp + -1].p5 = 1;
    }
    sqlite3VdbeAddOp3(pVVar24,0xe,iVar41,iVar44,iVar18);
    sqlite3VdbeResolveLabel(pVVar24,iVar16);
    if (pSVar43->pPrior != (Select *)0x0) {
      sqlite3ParserAddCleanup(pParse,sqlite3SelectDeleteGeneric,pSVar43->pPrior);
    }
    pSVar43->pPrior = pSVar25;
    pSVar25->pNext = pSVar43;
    if (pSVar25->pOrderBy != (ExprList *)0x0) {
      exprListDeleteNN(psVar5,pSVar25->pOrderBy);
    }
    pSVar25->pOrderBy = (ExprList *)0x0;
    if ((long)pParse->addrExplain == 0) {
      iVar16 = 0;
    }
    else {
      if (pParse->pVdbe->db->mallocFailed == '\0') {
        pOVar29 = pParse->pVdbe->aOp + pParse->addrExplain;
      }
      else {
        pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      iVar16 = pOVar29->p2;
    }
    pParse->addrExplain = iVar16;
    uVar17 = (uint)(pParse->nErr != 0);
    goto LAB_0018b071;
  }
  if (pSVar43->pPrior == (Select *)0x0) {
    sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
    sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
  }
  uVar4 = p->op;
  if ((uVar4 == 0x87) || (uVar4 == 0x89)) {
    destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    destA.nSdst = -0x55555556;
    destA._20_4_ = 0xaaaaaaaa;
    destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
    destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    destA.iSDParm2 = -0x55555556;
    destA.iSdst = -0x55555556;
    if (uVar13 == '\x01') {
      iVar16 = local_d8.iSDParm;
    }
    else {
      iVar16 = pParse->nTab;
      pParse->nTab = iVar16 + 1;
      iVar22 = sqlite3VdbeAddOp3(pVVar24,0x75,iVar16,0,0);
      p->addrOpenEphm[0] = iVar22;
      pSVar25 = p;
      do {
        pSVar38 = pSVar25;
        pSVar25 = pSVar38->pNext;
      } while (pSVar25 != (Select *)0x0);
      puVar3 = &pSVar38->selFlags;
      *(byte *)puVar3 = (byte)*puVar3 | 0x20;
    }
    destA.eDest = '\x01';
    destA.iSDParm = iVar16;
    destA.iSDParm2 = 0;
    destA.zAffSdst = (char *)0x0;
    destA.iSdst = 0;
    destA.nSdst = 0;
    uVar17 = sqlite3Select(pParse,pSVar43,&destA);
    if (uVar17 == 0) {
      p->pPrior = (Select *)0x0;
      pEVar30 = p->pLimit;
      p->pLimit = (Expr *)0x0;
      destA.eDest = (p->op == 0x89) + '\x01';
      bVar12 = p->op + 0x78;
      if (bVar12 < 3) {
        pcVar36 = (&PTR_anon_var_dwarf_7cd09_0023c730)[bVar12];
      }
      else {
        pcVar36 = "UNION";
      }
      sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar36);
      uVar17 = sqlite3Select(pParse,p,&destA);
      local_170 = p->pPrior;
      p->pPrior = pSVar43;
      p->pOrderBy = (ExprList *)0x0;
      if (p->op == 0x87) {
        LVar14 = sqlite3LogEstAdd(p->nSelectRow,pSVar43->nSelectRow);
        p->nSelectRow = LVar14;
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(psVar5,p->pLimit);
      }
      p->pLimit = pEVar30;
      p->iLimit = 0;
      p->iOffset = 0;
      if ((uVar13 != '\x01') && (psVar5->mallocFailed == '\0')) {
        iVar22 = pParse->nLabel + -1;
        iVar21 = pParse->nLabel + -2;
        pParse->nLabel = iVar21;
        computeLimitRegisters(pParse,p,iVar22);
        sqlite3VdbeAddOp3(pVVar24,0x24,iVar16,iVar22,0);
        iVar15 = pVVar24->nOp;
        selectInnerLoop(pParse,p,iVar16,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,iVar21,iVar22);
        sqlite3VdbeResolveLabel(pVVar24,iVar21);
        sqlite3VdbeAddOp3(pVVar24,0x27,iVar16,iVar15,0);
        sqlite3VdbeResolveLabel(pVVar24,iVar22);
LAB_0018ae18:
        sqlite3VdbeAddOp3(pVVar24,0x7a,iVar16,0,0);
      }
      goto LAB_0018ae36;
    }
  }
  else if (uVar4 == 0x88) {
    destA._0_8_ = destA._0_8_ & 0xffffffff00000000;
    iVar16 = p->iOffset;
    pSVar43->iLimit = p->iLimit;
    pSVar43->iOffset = iVar16;
    pSVar43->pLimit = p->pLimit;
    uVar17 = sqlite3Select(pParse,pSVar43,&local_d8);
    pSVar43->pLimit = (Expr *)0x0;
    if (uVar17 == 0) {
      p->pPrior = (Select *)0x0;
      p1 = pSVar43->iLimit;
      uVar8 = pSVar43->iOffset;
      p->iLimit = p1;
      p->iOffset = uVar8;
      if (p1 == 0) {
        iVar16 = 0;
      }
      else {
        iVar16 = sqlite3VdbeAddOp3(pVVar24,0x11,p1,0,0);
        iVar22 = p->iOffset;
        if (iVar22 != 0) {
          sqlite3VdbeAddOp3(pVVar24,0xa0,p->iLimit,iVar22 + 1,iVar22);
        }
      }
      sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
      uVar17 = sqlite3Select(pParse,p,&local_d8);
      local_170 = p->pPrior;
      p->pPrior = pSVar43;
      LVar14 = sqlite3LogEstAdd(p->nSelectRow,pSVar43->nSelectRow);
      p->nSelectRow = LVar14;
      if (p->pLimit != (Expr *)0x0) {
        iVar22 = sqlite3ExprIsInteger(p->pLimit->pLeft,(int *)&destA,pParse);
        if ((0 < (int)destA._0_4_ && iVar22 != 0) &&
           (sVar39 = p->nSelectRow, LVar14 = sqlite3LogEst(destA._0_8_ & 0xffffffff),
           LVar14 < sVar39)) {
          p->nSelectRow = LVar14;
        }
      }
      if (iVar16 != 0) {
        if (pVVar24->db->mallocFailed == '\0') {
          pOVar29 = pVVar24->aOp + iVar16;
        }
        else {
          pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar29->p2 = pVVar24->nOp;
      }
LAB_0018ae36:
      if (p->pNext == (Select *)0x0) {
        if ((long)pParse->addrExplain == 0) {
          iVar16 = 0;
        }
        else {
          if (pParse->pVdbe->db->mallocFailed == '\0') {
            pOVar29 = pParse->pVdbe->aOp + pParse->addrExplain;
          }
          else {
            pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          iVar16 = pOVar29->p2;
        }
        pParse->addrExplain = iVar16;
      }
      goto LAB_0018afc4;
    }
  }
  else {
    destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    destA.nSdst = -0x55555556;
    destA._20_4_ = 0xaaaaaaaa;
    destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
    destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    destA.iSDParm2 = -0x55555556;
    destA.iSdst = -0x55555556;
    iVar16 = pParse->nTab;
    pParse->nTab = iVar16 + 2;
    iVar22 = sqlite3VdbeAddOp3(pVVar24,0x75,iVar16,0,0);
    p->addrOpenEphm[0] = iVar22;
    pSVar25 = p;
    do {
      pSVar38 = pSVar25;
      pSVar25 = pSVar38->pNext;
    } while (pSVar25 != (Select *)0x0);
    puVar3 = &pSVar38->selFlags;
    *(byte *)puVar3 = (byte)*puVar3 | 0x20;
    destA.eDest = '\x01';
    destA.iSDParm = iVar16;
    destA.iSDParm2 = 0;
    destA.zAffSdst = (char *)0x0;
    destA.iSdst = 0;
    destA.nSdst = 0;
    uVar17 = sqlite3Select(pParse,pSVar43,&destA);
    if (uVar17 == 0) {
      iVar22 = iVar16 + 1;
      iVar15 = sqlite3VdbeAddOp3(pVVar24,0x75,iVar22,0,0);
      p->addrOpenEphm[1] = iVar15;
      p->pPrior = (Select *)0x0;
      pEVar30 = p->pLimit;
      p->pLimit = (Expr *)0x0;
      destA.iSDParm = iVar22;
      bVar12 = p->op + 0x78;
      if (bVar12 < 3) {
        pcVar36 = (&PTR_anon_var_dwarf_7cd09_0023c730)[bVar12];
      }
      else {
        pcVar36 = "UNION";
      }
      sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar36);
      uVar17 = sqlite3Select(pParse,p,&destA);
      local_170 = p->pPrior;
      p->pPrior = pSVar43;
      if (pSVar43->nSelectRow < p->nSelectRow) {
        p->nSelectRow = pSVar43->nSelectRow;
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(psVar5,p->pLimit);
      }
      p->pLimit = pEVar30;
      if (uVar17 == 0) {
        iVar15 = pParse->nLabel + -1;
        iVar21 = pParse->nLabel + -2;
        pParse->nLabel = iVar21;
        computeLimitRegisters(pParse,p,iVar15);
        sqlite3VdbeAddOp3(pVVar24,0x24,iVar16,iVar15,0);
        if (pParse->nTempReg == '\0') {
          iVar20 = pParse->nMem + 1;
          pParse->nMem = iVar20;
        }
        else {
          bVar12 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar12;
          iVar20 = pParse->aTempReg[bVar12];
        }
        iVar23 = sqlite3VdbeAddOp3(pVVar24,0x86,iVar16,iVar20,0);
        sqlite3VdbeAddOp4Int(pVVar24,0x1c,iVar22,iVar21,iVar20,0);
        if (iVar20 != 0) {
          bVar12 = pParse->nTempReg;
          if ((ulong)bVar12 < 8) {
            pParse->nTempReg = bVar12 + 1;
            pParse->aTempReg[bVar12] = iVar20;
          }
        }
        selectInnerLoop(pParse,p,iVar16,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,iVar21,iVar15);
        sqlite3VdbeResolveLabel(pVVar24,iVar21);
        sqlite3VdbeAddOp3(pVVar24,0x27,iVar16,iVar23,0);
        sqlite3VdbeResolveLabel(pVVar24,iVar15);
        sqlite3VdbeAddOp3(pVVar24,0x7a,iVar22,0,0);
        goto LAB_0018ae18;
      }
      goto LAB_0018ae36;
    }
  }
LAB_0018a755:
  pDest->iSdst = local_d8.iSdst;
  pDest->nSdst = local_d8.nSdst;
LAB_0018b071:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar17;
  }
  __stack_chk_fail();
  while( true ) {
    pSVar25->nSelectRow = sVar39;
    pSVar25 = pSVar25->pNext;
    if (pSVar25 == (Select *)0x0) break;
LAB_0018a484:
    selectInnerLoop(pParse,pSVar25,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,1,1);
    if (pEVar30 != (Expr *)0x0) break;
  }
  uVar17 = 0;
  goto LAB_0018a755;
  while (lVar31 = lVar31 + 0x48, (long)pSVar6->nSrc * 0x48 != lVar31) {
LAB_0018a562:
    if (((&pSVar6->a[0].fg.field_0x1)[lVar31] & 0x80) != 0) {
      iVar21 = *(int *)((long)&pSVar6->a[0].iCursor + lVar31);
      goto LAB_0018aa22;
    }
  }
  iVar21 = 0;
LAB_0018aa22:
  pEVar28 = p->pOrderBy;
  iVar23 = pParse->nTab;
  iVar44 = iVar23 + 1;
  pParse->nTab = iVar44;
  if (p->op == 0x87) {
    uVar13 = '\x06' - (pEVar28 == (ExprList *)0x0);
    pParse->nTab = iVar23 + 2;
  }
  else {
    iVar44 = 0;
    uVar13 = (pEVar28 == (ExprList *)0x0) + '\a';
  }
  destA.eDest = uVar13;
  destA.iSDParm = iVar23;
  destA.iSDParm2 = 0;
  destA.zAffSdst = (char *)0x0;
  destA.iSdst = 0;
  destA.nSdst = 0;
  iVar33 = pParse->nMem + 1;
  pParse->nMem = iVar33;
  sqlite3VdbeAddOp3(p_00,0x79,iVar21,iVar33,iVar16);
  if (pEVar28 == (ExprList *)0x0) {
    sqlite3VdbeAddOp3(p_00,0x75,iVar23,iVar16,0);
  }
  else {
    pKVar26 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
    iVar16 = sqlite3VdbeAddOp3(p_00,0x75,iVar23,pEVar28->nExpr + 2,0);
    sqlite3VdbeChangeP4(p_00,iVar16,(char *)pKVar26,-8);
    destA.pOrderBy = pEVar28;
  }
  if (iVar44 == 0) {
    uVar17 = p->selFlags;
  }
  else {
    iVar16 = sqlite3VdbeAddOp3(p_00,0x75,iVar44,0,0);
    p->addrOpenEphm[0] = iVar16;
    uVar17 = p->selFlags | 0x20;
    p->selFlags = uVar17;
  }
  p->pOrderBy = (ExprList *)0x0;
  pSVar43 = p;
  do {
    pSVar25 = pSVar43;
    if ((uVar17 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
      goto LAB_0018af93;
    }
    pSVar25->op = 0x88;
    pSVar43 = pSVar25->pPrior;
    uVar17 = pSVar43->selFlags;
  } while ((uVar17 >> 0xd & 1) != 0);
  pSVar43->pNext = (Select *)0x0;
  sqlite3VdbeExplain(pParse,'\x01',"SETUP");
  iVar16 = sqlite3Select(pParse,pSVar43,&destA);
  pSVar43->pNext = p;
  if (iVar16 == 0) {
    iVar16 = sqlite3VdbeAddOp3(p_00,0x24,iVar23,iVar20,0);
    sqlite3VdbeAddOp3(p_00,0x88,iVar21,0,0);
    if (pEVar28 == (ExprList *)0x0) {
      iVar41 = 0x86;
      iVar42 = 0;
      iVar44 = iVar33;
    }
    else {
      iVar41 = 0x5e;
      iVar44 = pEVar28->nExpr + 1;
      iVar42 = iVar33;
    }
    sqlite3VdbeAddOp3(p_00,iVar41,iVar23,iVar44,iVar42);
    sqlite3VdbeAddOp3(p_00,0x82,iVar23,0,0);
    iVar23 = pParse->nLabel + -1;
    pParse->nLabel = iVar23;
    if (0 < iVar15) {
      sqlite3VdbeAddOp3(p_00,0x32,iVar15,iVar23,1);
    }
    selectInnerLoop(pParse,p,iVar21,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,iVar23,iVar20);
    if (iVar22 != 0) {
      sqlite3VdbeAddOp3(p_00,0x3d,iVar22,iVar20,0);
    }
    sqlite3VdbeResolveLabel(p_00,iVar23);
    pSVar25->pPrior = (Select *)0x0;
    sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
    sqlite3Select(pParse,p,&destA);
    pSVar25->pPrior = pSVar43;
    sqlite3VdbeAddOp3(p_00,9,0,iVar16,0);
    sqlite3VdbeResolveLabel(p_00,iVar20);
  }
LAB_0018af93:
  if (p->pOrderBy != (ExprList *)0x0) {
    exprListDeleteNN(pParse->db,p->pOrderBy);
  }
  p->pOrderBy = pEVar28;
  p->pLimit = pEVar30;
LAB_0018afbb:
  local_170 = (Select *)0x0;
  uVar17 = 0;
LAB_0018afc4:
  if ((pParse->nErr == 0) && ((p->selFlags & 0x20) != 0)) {
    iVar16 = p->pEList->nExpr;
    pKVar26 = sqlite3KeyInfoAlloc(psVar5,iVar16,1);
    if (pKVar26 == (KeyInfo *)0x0) {
      uVar17 = 7;
    }
    else {
      if (iVar16 < 1) goto LAB_0018b0a2;
      lVar31 = 0;
      do {
        pCVar27 = multiSelectCollSeq(pParse,p,(int)lVar31);
        pKVar26->aColl[lVar31] = pCVar27;
        if (pCVar27 == (CollSeq *)0x0) {
          pKVar26->aColl[lVar31] = psVar5->pDfltColl;
        }
        lVar31 = lVar31 + 1;
      } while (iVar16 != (int)lVar31);
      for (; p != (Select *)0x0; p = p->pPrior) {
LAB_0018b0a2:
        lVar31 = 0;
        bVar11 = true;
        do {
          bVar40 = bVar11;
          iVar22 = p->addrOpenEphm[lVar31];
          if ((long)iVar22 < 0) break;
          if (pVVar24->db->mallocFailed == '\0') {
            pOVar29 = pVVar24->aOp + iVar22;
          }
          else {
            pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar29->p2 = iVar16;
          pKVar26->nRef = pKVar26->nRef + 1;
          sqlite3VdbeChangeP4(pVVar24,iVar22,(char *)pKVar26,-8);
          p->addrOpenEphm[lVar31] = -1;
          lVar31 = 1;
          bVar11 = false;
        } while (bVar40);
      }
      pKVar26->nRef = pKVar26->nRef - 1;
      if (pKVar26->nRef == 0) {
        sqlite3DbNNFreeNN(pKVar26->db,pKVar26);
      }
    }
  }
  pDest->iSdst = local_d8.iSdst;
  pDest->nSdst = local_d8.nSdst;
  if (local_170 != (Select *)0x0) {
    sqlite3ParserAddCleanup(pParse,sqlite3SelectDeleteGeneric,local_170);
  }
  goto LAB_0018b071;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  assert( p->selFlags & SF_Compound );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  assert( pPrior->pOrderBy==0 );
  assert( pPrior->pLimit==0 );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    if( rc>=0 ) goto multi_select_end;
    rc = SQLITE_OK;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( (p->selFlags & SF_Recursive)!=0 && hasAnchor(p) ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit = 0;  /* Initialize to suppress harmless compiler warning */
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        TREETRACE(0x200, pParse, p, ("multiSelect UNION ALL left...\n"));
        rc = sqlite3Select(pParse, pPrior, &dest);
        pPrior->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        TREETRACE(0x200, pParse, p, ("multiSelect UNION ALL right...\n"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( p->pLimit
         && sqlite3ExprIsInteger(p->pLimit->pLeft, &nLimit, pParse)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit)
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;

        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }


        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        TREETRACE(0x200, pParse, p, ("multiSelect EXCEPT/UNION left...\n"));
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        TREETRACE(0x200, pParse, p, ("multiSelect EXCEPT/UNION right...\n"));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        assert( p->pOrderBy==0 );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;

        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        assert( p->pEList || db->mallocFailed );
        if( dest.eDest!=priorOp && db->mallocFailed==0 ){
          int iCont, iBreak, iStart;
          iBreak = sqlite3VdbeMakeLabel(pParse);
          iCont = sqlite3VdbeMakeLabel(pParse);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;

        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );

        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );

        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        TREETRACE(0x400, pParse, p, ("multiSelect INTERSECT left...\n"));
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        TREETRACE(0x400, pParse, p, ("multiSelect INTERSECT right...\n"));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;

        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        if( rc ) break;
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(pParse);
        iCont = sqlite3VdbeMakeLabel(pParse);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }

  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  if( pParse->nErr ) goto multi_select_end;

  /* Compute collating sequences used by
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    assert( p->pEList!=0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if( pDelete ){
    sqlite3ParserAddCleanup(pParse, sqlite3SelectDeleteGeneric, pDelete);
  }
  return rc;
}